

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_select_node.cpp
# Opt level: O2

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::Transformer::TransformSelectInternal(Transformer *this,PGSelectStmt *stmt)

{
  Transformer *pTVar1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  optional_ptr<duckdb_libpgquery::PGWindowDef,_true> oVar5;
  pointer pQVar6;
  SetOperationNode *pSVar7;
  PGWithClause *pPVar8;
  type node;
  SelectNode *select_node;
  PGWindowDef *pPVar9;
  iterator iVar10;
  mapped_type *ppPVar11;
  pointer pDVar12;
  InternalException *pIVar13;
  ParserException *pPVar14;
  NotImplementedException *this_00;
  uint uVar15;
  PGSelectStmt *in_RDX;
  _Alloc_hider _Var16;
  PGList *pPVar17;
  string window_name;
  allocator local_a1;
  string local_a0;
  optional_ptr<duckdb_libpgquery::PGList,_true> local_80;
  optional_ptr<duckdb_libpgquery::PGWindowDef,_true> window_def;
  StackChecker<duckdb::Transformer> stack_checker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  StackCheck((Transformer *)&stack_checker,(idx_t)stmt);
  (this->parent).ptr = (Transformer *)0x0;
  if (in_RDX->op - PG_SETOP_UNION < 4) {
    make_uniq<duckdb::SetOperationNode>();
    _Var16 = window_name._M_dataplus;
    window_name._M_dataplus._M_p = (pointer)0x0;
    pTVar1 = (this->parent).ptr;
    (this->parent).ptr = (Transformer *)_Var16._M_p;
    if (pTVar1 != (Transformer *)0x0) {
      (*(code *)((pTVar1->parent).ptr)->options)();
      if (window_name._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)window_name._M_dataplus._M_p + 8))();
      }
    }
    pQVar6 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                       ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                         *)this);
    pSVar7 = QueryNode::Cast<duckdb::SetOperationNode>(pQVar6);
    if (in_RDX->withClause != (PGWithClause *)0x0) {
      window_name._M_dataplus._M_p = (pointer)in_RDX->withClause;
      pPVar8 = optional_ptr<duckdb_libpgquery::PGWithClause,_true>::operator*
                         ((optional_ptr<duckdb_libpgquery::PGWithClause,_true> *)&window_name);
      pQVar6 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
               operator->((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                           *)this);
      TransformCTE((Transformer *)stmt,pPVar8,&pQVar6->cte_map);
    }
    TransformSelectNode((Transformer *)&window_name,(PGNode *)stmt,SUB81(in_RDX->larg,0));
    _Var16 = window_name._M_dataplus;
    window_name._M_dataplus._M_p = (pointer)0x0;
    _Var2._M_head_impl =
         (pSVar7->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
         ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar7->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
    .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)_Var16._M_p;
    if (_Var2._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
      if (window_name._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)window_name._M_dataplus._M_p + 8))();
      }
    }
    TransformSelectNode((Transformer *)&window_name,(PGNode *)stmt,SUB81(in_RDX->rarg,0));
    _Var16 = window_name._M_dataplus;
    window_name._M_dataplus._M_p = (pointer)0x0;
    _Var2._M_head_impl =
         (pSVar7->right).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar7->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)_Var16._M_p;
    if (_Var2._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
      if (window_name._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)window_name._M_dataplus._M_p + 8))();
      }
    }
    if (((pSVar7->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
         ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl == (QueryNode *)0x0) ||
       ((pSVar7->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
        ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl == (QueryNode *)0x0)) {
      pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&window_name,"Failed to transform setop children.",(allocator *)&local_a0
                );
      InternalException::InternalException(pIVar13,&window_name);
      __cxa_throw(pIVar13,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar7->setop_all = in_RDX->all;
    uVar15 = in_RDX->op - PG_SETOP_UNION;
    if (3 < uVar15) {
      pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&window_name,"Unexpected setop type",(allocator *)&local_a0);
      InternalException::InternalException(pIVar13,&window_name);
      __cxa_throw(pIVar13,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar7->setop_type = (SetOperationType)(0x4020301 >> ((char)uVar15 * '\b' & 0x1fU));
    if (in_RDX->sampleOptions != (PGNode *)0x0) {
      pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&window_name,"SAMPLE clause is only allowed in regular SELECT statements"
                 ,(allocator *)&local_a0);
      ParserException::ParserException(pPVar14,&window_name);
      __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_0066d7b9;
  }
  if (in_RDX->op != PG_SETOP_NONE) {
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&window_name,"Statement type %d not implemented!",(allocator *)&local_a0);
    NotImplementedException::NotImplementedException<duckdb_libpgquery::PGSetOperation>
              (this_00,&window_name,in_RDX->op);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  make_uniq<duckdb::SelectNode>();
  _Var16 = window_name._M_dataplus;
  window_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1 = (this->parent).ptr;
  (this->parent).ptr = (Transformer *)_Var16._M_p;
  if (pTVar1 != (Transformer *)0x0) {
    (*(code *)((pTVar1->parent).ptr)->options)();
    if (window_name._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)window_name._M_dataplus._M_p + 8))();
    }
  }
  pQVar6 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *
                      )this);
  select_node = QueryNode::Cast<duckdb::SelectNode>(pQVar6);
  if (in_RDX->withClause != (PGWithClause *)0x0) {
    window_name._M_dataplus._M_p = (pointer)in_RDX->withClause;
    pPVar8 = optional_ptr<duckdb_libpgquery::PGWithClause,_true>::operator*
                       ((optional_ptr<duckdb_libpgquery::PGWithClause,_true> *)&window_name);
    pQVar6 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                       ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                         *)this);
    TransformCTE((Transformer *)stmt,pPVar8,&pQVar6->cte_map);
  }
  pPVar17 = in_RDX->windowClause;
  local_80.ptr = (PGList *)stmt;
  if (pPVar17 != (PGList *)0x0) {
    while (pPVar17 = (PGList *)pPVar17->head, pPVar17 != (PGList *)0x0) {
      window_def.ptr = *(PGWindowDef **)pPVar17;
      pPVar9 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator->(&window_def);
      ::std::__cxx11::string::string((string *)&window_name,pPVar9->name,(allocator *)&local_a0);
      iVar10 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&stmt->pivot,&window_name);
      oVar5 = window_def;
      if (iVar10.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
          ._M_cur != (__node_type *)0x0) {
        pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_a0,"window \"%s\" is already defined",&local_a1);
        ::std::__cxx11::string::string((string *)&local_50,(string *)&window_name);
        ParserException::ParserException<std::__cxx11::string>(pPVar14,&local_a0,&local_50);
        __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ppPVar11 = ::std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&stmt->pivot,&window_name);
      *ppPVar11 = oVar5.ptr;
      ::std::__cxx11::string::~string((string *)&window_name);
    }
  }
  stmt = (PGSelectStmt *)local_80.ptr;
  if (in_RDX->distinctClause != (PGList *)0x0) {
    make_uniq<duckdb::DistinctModifier>();
    pPVar17 = in_RDX->distinctClause;
    if ((pPVar17->head->data).ptr_value != (void *)0x0) {
      pDVar12 = unique_ptr<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>,_true>
                ::operator->((unique_ptr<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>,_true>
                              *)&window_name);
      TransformExpressionList((Transformer *)stmt,pPVar17,&pDVar12->distinct_on_targets);
    }
    local_a0._M_dataplus._M_p = window_name._M_dataplus._M_p;
    window_name._M_dataplus._M_p = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                *)&(select_node->super_QueryNode).modifiers,
               (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                *)&local_a0);
    if ((long *)local_a0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a0._M_dataplus._M_p + 8))();
    }
    if (window_name._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)window_name._M_dataplus._M_p + 8))();
    }
  }
  if (in_RDX->valuesLists == (PGList *)0x0) {
    if (in_RDX->targetList == (PGList *)0x0) {
      pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&window_name,"SELECT clause without selection list",
                 (allocator *)&local_a0);
      ParserException::ParserException(pPVar14,&window_name);
      __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (in_RDX->from_first == true) {
      TransformFrom((Transformer *)&window_name,(optional_ptr<duckdb_libpgquery::PGList,_true>)stmt)
      ;
      _Var16 = window_name._M_dataplus;
      window_name._M_dataplus._M_p = (pointer)0x0;
      _Var3._M_head_impl =
           (select_node->from_table).
           super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
           super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
      (select_node->from_table).
      super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
      super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)_Var16._M_p;
      if (_Var3._M_head_impl != (TableRef *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_TableRef + 8))();
        if (window_name._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)window_name._M_dataplus._M_p + 8))();
        }
      }
      TransformExpressionList((Transformer *)stmt,in_RDX->targetList,&select_node->select_list);
    }
    else {
      TransformExpressionList((Transformer *)stmt,in_RDX->targetList,&select_node->select_list);
      TransformFrom((Transformer *)&window_name,(optional_ptr<duckdb_libpgquery::PGList,_true>)stmt)
      ;
      _Var16 = window_name._M_dataplus;
      window_name._M_dataplus._M_p = (pointer)0x0;
      _Var3._M_head_impl =
           (select_node->from_table).
           super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
           super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
      (select_node->from_table).
      super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
      super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)_Var16._M_p;
      if (_Var3._M_head_impl != (TableRef *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_TableRef + 8))();
        _Var16 = window_name._M_dataplus;
        goto LAB_0066da18;
      }
    }
  }
  else {
    TransformValuesList((Transformer *)&window_name,(PGList *)stmt);
    _Var3._M_head_impl =
         (select_node->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (select_node->from_table).
    super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
         (TableRef *)window_name._M_dataplus._M_p;
    if (_Var3._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_TableRef + 8))();
    }
    make_uniq<duckdb::StarExpression>();
    window_name._M_dataplus._M_p = local_a0._M_dataplus._M_p;
    local_a0._M_dataplus._M_p = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&select_node->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&window_name);
    if (window_name._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)window_name._M_dataplus._M_p + 8))();
    }
    window_name._M_dataplus._M_p = (pointer)0x0;
    _Var16._M_p = local_a0._M_dataplus._M_p;
LAB_0066da18:
    if ((long *)_Var16._M_p != (long *)0x0) {
      (**(code **)(*(long *)_Var16._M_p + 8))();
    }
  }
  TransformExpression((Transformer *)&window_name,
                      (optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
  _Var16 = window_name._M_dataplus;
  window_name._M_dataplus._M_p = (pointer)0x0;
  _Var4._M_head_impl =
       (select_node->where_clause).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (select_node->where_clause).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (ParsedExpression *)_Var16._M_p;
  if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
    if (window_name._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)window_name._M_dataplus._M_p + 8))();
    }
  }
  TransformGroupBy((Transformer *)stmt,in_RDX->groupClause,select_node);
  TransformExpression((Transformer *)&window_name,
                      (optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
  _Var16 = window_name._M_dataplus;
  window_name._M_dataplus._M_p = (pointer)0x0;
  _Var4._M_head_impl =
       (select_node->having).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (select_node->having).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (ParsedExpression *)_Var16._M_p;
  if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
    if (window_name._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)window_name._M_dataplus._M_p + 8))();
    }
  }
  TransformExpression((Transformer *)&window_name,
                      (optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
  _Var16 = window_name._M_dataplus;
  window_name._M_dataplus._M_p = (pointer)0x0;
  _Var4._M_head_impl =
       (select_node->qualify).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (select_node->qualify).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (ParsedExpression *)_Var16._M_p;
  if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
    if (window_name._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)window_name._M_dataplus._M_p + 8))();
    }
  }
  TransformSampleOptions
            ((Transformer *)&window_name,(optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
  _Var16 = window_name._M_dataplus;
  window_name._M_dataplus._M_p = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::reset
            ((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
             &select_node->sample,(pointer)_Var16._M_p);
  ::std::unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::~unique_ptr
            ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
             &window_name);
LAB_0066d7b9:
  node = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
                   ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                    this);
  TransformModifiers((Transformer *)stmt,in_RDX,node);
  (stack_checker.recursive_class)->stack_depth =
       (stack_checker.recursive_class)->stack_depth - stack_checker.stack_usage;
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> Transformer::TransformSelectInternal(duckdb_libpgquery::PGSelectStmt &stmt) {
	D_ASSERT(stmt.type == duckdb_libpgquery::T_PGSelectStmt);
	auto stack_checker = StackCheck();

	unique_ptr<QueryNode> node;

	switch (stmt.op) {
	case duckdb_libpgquery::PG_SETOP_NONE: {
		node = make_uniq<SelectNode>();
		auto &result = node->Cast<SelectNode>();
		if (stmt.withClause) {
			TransformCTE(*PGPointerCast<duckdb_libpgquery::PGWithClause>(stmt.withClause), node->cte_map);
		}
		if (stmt.windowClause) {
			for (auto window_ele = stmt.windowClause->head; window_ele != nullptr; window_ele = window_ele->next) {
				auto window_def = PGPointerCast<duckdb_libpgquery::PGWindowDef>(window_ele->data.ptr_value);
				D_ASSERT(window_def);
				D_ASSERT(window_def->name);
				string window_name(window_def->name);
				auto it = window_clauses.find(window_name);
				if (it != window_clauses.end()) {
					throw ParserException("window \"%s\" is already defined", window_name);
				}
				window_clauses[window_name] = window_def.get();
			}
		}

		// checks distinct clause
		if (stmt.distinctClause != nullptr) {
			auto modifier = make_uniq<DistinctModifier>();
			// checks distinct on clause
			auto target = PGPointerCast<duckdb_libpgquery::PGNode>(stmt.distinctClause->head->data.ptr_value);
			if (target) {
				//  add the columns defined in the ON clause to the select list
				TransformExpressionList(*stmt.distinctClause, modifier->distinct_on_targets);
			}
			result.modifiers.push_back(std::move(modifier));
		}

		// do this early so the value lists also have a `FROM`
		if (stmt.valuesLists) {
			// VALUES list, create an ExpressionList
			D_ASSERT(!stmt.fromClause);
			result.from_table = TransformValuesList(stmt.valuesLists);
			result.select_list.push_back(make_uniq<StarExpression>());
		} else {
			if (!stmt.targetList) {
				throw ParserException("SELECT clause without selection list");
			}
			// transform in the specified order to ensure positional parameters are correctly set
			if (stmt.from_first) {
				result.from_table = TransformFrom(stmt.fromClause);
				TransformExpressionList(*stmt.targetList, result.select_list);
			} else {
				TransformExpressionList(*stmt.targetList, result.select_list);
				result.from_table = TransformFrom(stmt.fromClause);
			}
		}

		// where
		result.where_clause = TransformExpression(stmt.whereClause);
		// group by
		TransformGroupBy(stmt.groupClause, result);
		// having
		result.having = TransformExpression(stmt.havingClause);
		// qualify
		result.qualify = TransformExpression(stmt.qualifyClause);
		// sample
		result.sample = TransformSampleOptions(stmt.sampleOptions);
		break;
	}
	case duckdb_libpgquery::PG_SETOP_UNION:
	case duckdb_libpgquery::PG_SETOP_EXCEPT:
	case duckdb_libpgquery::PG_SETOP_INTERSECT:
	case duckdb_libpgquery::PG_SETOP_UNION_BY_NAME: {
		node = make_uniq<SetOperationNode>();
		auto &result = node->Cast<SetOperationNode>();
		if (stmt.withClause) {
			TransformCTE(*PGPointerCast<duckdb_libpgquery::PGWithClause>(stmt.withClause), node->cte_map);
		}
		result.left = TransformSelectNode(*stmt.larg);
		result.right = TransformSelectNode(*stmt.rarg);
		if (!result.left || !result.right) {
			throw InternalException("Failed to transform setop children.");
		}

		result.setop_all = stmt.all;
		switch (stmt.op) {
		case duckdb_libpgquery::PG_SETOP_UNION:
			result.setop_type = SetOperationType::UNION;
			break;
		case duckdb_libpgquery::PG_SETOP_EXCEPT:
			result.setop_type = SetOperationType::EXCEPT;
			break;
		case duckdb_libpgquery::PG_SETOP_INTERSECT:
			result.setop_type = SetOperationType::INTERSECT;
			break;
		case duckdb_libpgquery::PG_SETOP_UNION_BY_NAME:
			result.setop_type = SetOperationType::UNION_BY_NAME;
			break;
		default:
			throw InternalException("Unexpected setop type");
		}
		if (stmt.sampleOptions) {
			throw ParserException("SAMPLE clause is only allowed in regular SELECT statements");
		}
		break;
	}
	default:
		throw NotImplementedException("Statement type %d not implemented!", stmt.op);
	}

	TransformModifiers(stmt, *node);

	return node;
}